

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  list *this_00;
  byte bVar1;
  handle hVar2;
  _func_void_instance_ptr_void_ptr *p_Var3;
  bool bVar4;
  type_info *ptVar5;
  PyObject *pPVar6;
  size_t sVar7;
  PyTypeObject *type;
  type_info *tinfo;
  allocator<char> local_89;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  hVar2.m_ptr = (rec->scope).m_ptr;
  if (hVar2.m_ptr != (PyObject *)0x0) {
    bVar4 = hasattr(hVar2,"__dict__");
    if (bVar4) {
      local_88._8_8_ = (rec->scope).m_ptr;
      local_78._0_8_ = "__dict__";
      local_78._8_8_ = (PyObject *)0x0;
      bVar4 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              ::contains<char_const*const&>
                        ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                          *)local_88,&rec->name);
      object::~object((object *)(local_78 + 8));
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,rec->name,&local_89);
        std::operator+(&local_68,"generic_type: cannot initialize type \"",&local_48);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                       ,&local_68,"\": an object with that name is already defined");
        pybind11_fail((string *)local_88);
      }
    }
  }
  local_88._0_8_ = rec->type;
  if ((rec->field_0x80 & 0x10) == 0) {
    ptVar5 = get_global_type_info((type_index *)local_88);
  }
  else {
    ptVar5 = get_local_type_info((type_index *)local_88);
  }
  if (ptVar5 == (type_info *)0x0) {
    pPVar6 = make_new_python_type(rec);
    (this->super_object).super_handle.m_ptr = pPVar6;
    local_68._M_dataplus._M_p = (pointer)operator_new(0x98);
    local_68._M_dataplus._M_p[0x40] = '\0';
    local_68._M_dataplus._M_p[0x41] = '\0';
    local_68._M_dataplus._M_p[0x42] = '\0';
    local_68._M_dataplus._M_p[0x43] = '\0';
    local_68._M_dataplus._M_p[0x44] = '\0';
    local_68._M_dataplus._M_p[0x45] = '\0';
    local_68._M_dataplus._M_p[0x46] = '\0';
    local_68._M_dataplus._M_p[0x47] = '\0';
    local_68._M_dataplus._M_p[0x48] = '\0';
    local_68._M_dataplus._M_p[0x49] = '\0';
    local_68._M_dataplus._M_p[0x4a] = '\0';
    local_68._M_dataplus._M_p[0x4b] = '\0';
    local_68._M_dataplus._M_p[0x4c] = '\0';
    local_68._M_dataplus._M_p[0x4d] = '\0';
    local_68._M_dataplus._M_p[0x4e] = '\0';
    local_68._M_dataplus._M_p[0x4f] = '\0';
    local_68._M_dataplus._M_p[0x50] = '\0';
    local_68._M_dataplus._M_p[0x51] = '\0';
    local_68._M_dataplus._M_p[0x52] = '\0';
    local_68._M_dataplus._M_p[0x53] = '\0';
    local_68._M_dataplus._M_p[0x54] = '\0';
    local_68._M_dataplus._M_p[0x55] = '\0';
    local_68._M_dataplus._M_p[0x56] = '\0';
    local_68._M_dataplus._M_p[0x57] = '\0';
    local_68._M_dataplus._M_p[0x58] = '\0';
    local_68._M_dataplus._M_p[0x59] = '\0';
    local_68._M_dataplus._M_p[0x5a] = '\0';
    local_68._M_dataplus._M_p[0x5b] = '\0';
    local_68._M_dataplus._M_p[0x5c] = '\0';
    local_68._M_dataplus._M_p[0x5d] = '\0';
    local_68._M_dataplus._M_p[0x5e] = '\0';
    local_68._M_dataplus._M_p[0x5f] = '\0';
    local_68._M_dataplus._M_p[0x60] = '\0';
    local_68._M_dataplus._M_p[0x61] = '\0';
    local_68._M_dataplus._M_p[0x62] = '\0';
    local_68._M_dataplus._M_p[99] = '\0';
    local_68._M_dataplus._M_p[100] = '\0';
    local_68._M_dataplus._M_p[0x65] = '\0';
    local_68._M_dataplus._M_p[0x66] = '\0';
    local_68._M_dataplus._M_p[0x67] = '\0';
    local_68._M_dataplus._M_p[0x68] = '\0';
    local_68._M_dataplus._M_p[0x69] = '\0';
    local_68._M_dataplus._M_p[0x6a] = '\0';
    local_68._M_dataplus._M_p[0x6b] = '\0';
    local_68._M_dataplus._M_p[0x6c] = '\0';
    local_68._M_dataplus._M_p[0x6d] = '\0';
    local_68._M_dataplus._M_p[0x6e] = '\0';
    local_68._M_dataplus._M_p[0x6f] = '\0';
    local_68._M_dataplus._M_p[0x70] = '\0';
    local_68._M_dataplus._M_p[0x71] = '\0';
    local_68._M_dataplus._M_p[0x72] = '\0';
    local_68._M_dataplus._M_p[0x73] = '\0';
    local_68._M_dataplus._M_p[0x74] = '\0';
    local_68._M_dataplus._M_p[0x75] = '\0';
    local_68._M_dataplus._M_p[0x76] = '\0';
    local_68._M_dataplus._M_p[0x77] = '\0';
    local_68._M_dataplus._M_p[0x78] = '\0';
    local_68._M_dataplus._M_p[0x79] = '\0';
    local_68._M_dataplus._M_p[0x7a] = '\0';
    local_68._M_dataplus._M_p[0x7b] = '\0';
    local_68._M_dataplus._M_p[0x7c] = '\0';
    local_68._M_dataplus._M_p[0x7d] = '\0';
    local_68._M_dataplus._M_p[0x7e] = '\0';
    local_68._M_dataplus._M_p[0x7f] = '\0';
    local_68._M_dataplus._M_p[0x80] = '\0';
    local_68._M_dataplus._M_p[0x81] = '\0';
    local_68._M_dataplus._M_p[0x82] = '\0';
    local_68._M_dataplus._M_p[0x83] = '\0';
    local_68._M_dataplus._M_p[0x84] = '\0';
    local_68._M_dataplus._M_p[0x85] = '\0';
    local_68._M_dataplus._M_p[0x86] = '\0';
    local_68._M_dataplus._M_p[0x87] = '\0';
    local_68._M_dataplus._M_p[0x88] = '\0';
    local_68._M_dataplus._M_p[0x89] = '\0';
    local_68._M_dataplus._M_p[0x8a] = '\0';
    local_68._M_dataplus._M_p[0x8b] = '\0';
    local_68._M_dataplus._M_p[0x8c] = '\0';
    local_68._M_dataplus._M_p[0x8d] = '\0';
    local_68._M_dataplus._M_p[0x8e] = '\0';
    local_68._M_dataplus._M_p[0x8f] = '\0';
    local_68._M_dataplus._M_p[0x90] = '\0';
    local_68._M_dataplus._M_p[0x91] = '\0';
    local_68._M_dataplus._M_p[0x92] = '\0';
    local_68._M_dataplus._M_p[0x93] = '\0';
    local_68._M_dataplus._M_p[0x94] = '\0';
    local_68._M_dataplus._M_p[0x95] = '\0';
    local_68._M_dataplus._M_p[0x96] = '\0';
    local_68._M_dataplus._M_p[0x97] = '\0';
    local_88._8_8_ = &local_68;
    *(PyObject **)local_68._M_dataplus._M_p = pPVar6;
    *(type_info **)(local_68._M_dataplus._M_p + 8) = rec->type;
    sVar7 = rec->type_align;
    *(size_t *)(local_68._M_dataplus._M_p + 0x10) = rec->type_size;
    *(size_t *)(local_68._M_dataplus._M_p + 0x18) = sVar7;
    *(size_t *)(local_68._M_dataplus._M_p + 0x20) = (rec->holder_size - 1 >> 3) + 1;
    p_Var3 = rec->init_instance;
    *(_func_void_ptr_size_t **)(local_68._M_dataplus._M_p + 0x28) = rec->operator_new;
    *(_func_void_instance_ptr_void_ptr **)(local_68._M_dataplus._M_p + 0x30) = p_Var3;
    *(_func_void_value_and_holder_ptr **)(local_68._M_dataplus._M_p + 0x38) = rec->dealloc;
    local_68._M_dataplus._M_p[0x90] = (byte)rec->field_0x80 >> 1 & 0xc | 3;
    local_88._0_8_ = rec;
    local_78._0_8_ = this;
    with_internals<pybind11::detail::generic_type::initialize(pybind11::detail::type_record_const&)::_lambda(pybind11::detail::internals&)_1_>
              ((anon_class_24_3_13231fe3 *)local_88);
    this_00 = &rec->bases;
    sVar7 = list::size(this_00);
    if ((sVar7 < 2) && ((rec->field_0x80 & 1) == 0)) {
      sVar7 = list::size(this_00);
      if (sVar7 == 1) {
        local_88._8_8_ = (this_00->super_object).super_handle.m_ptr;
        local_78._0_8_ = (generic_type *)0x0;
        local_78._8_8_ = (PyObject *)0x0;
        type = (PyTypeObject *)
               accessor<pybind11::detail::accessor_policies::list_item>::ptr
                         ((accessor<pybind11::detail::accessor_policies::list_item> *)local_88);
        ptVar5 = get_type_info(type);
        object::~object((object *)(local_78 + 8));
        if (ptVar5 == (type_info *)0x0) {
          __assert_fail("parent_tinfo != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                        ,0x5a2,
                        "void pybind11::detail::generic_type::initialize(const type_record &)");
        }
        bVar1 = ptVar5->field_0x90;
        local_68._M_dataplus._M_p[0x90] = local_68._M_dataplus._M_p[0x90] & 0xfdU | bVar1 & 2;
        ptVar5->field_0x90 = ptVar5->field_0x90 & (bVar1 >> 1 | 0xfe);
      }
    }
    else {
      mark_parents_nonsimple(this,*(PyTypeObject **)local_68._M_dataplus._M_p);
      local_68._M_dataplus._M_p[0x90] = local_68._M_dataplus._M_p[0x90] & 0xfd;
    }
    if ((rec->field_0x80 & 0x10) != 0) {
      *(code **)(local_68._M_dataplus._M_p + 0x88) = type_caster_generic::local_load;
      hVar2.m_ptr = (this->super_object).super_handle.m_ptr;
      capsule::capsule((capsule *)local_88,local_68._M_dataplus._M_p,(char *)0x0,
                       (PyCapsule_Destructor)0x0);
      setattr(hVar2,"__pybind11_module_local_v4_clang_libstdcpp_cxxabi1002__",(handle)local_88._0_8_
             );
      object::~object((object *)local_88);
    }
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,rec->name,&local_89);
  std::operator+(&local_68,"generic_type: type \"",&local_48);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_68,"\" is already registered!");
  pybind11_fail((string *)local_88);
}

Assistant:

void initialize(const type_record &rec) {
        if (rec.scope && hasattr(rec.scope, "__dict__")
            && rec.scope.attr("__dict__").contains(rec.name)) {
            pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec.name)
                          + "\": an object with that name is already defined");
        }

        if ((rec.module_local ? get_local_type_info(*rec.type) : get_global_type_info(*rec.type))
            != nullptr) {
            pybind11_fail("generic_type: type \"" + std::string(rec.name)
                          + "\" is already registered!");
        }

        m_ptr = make_new_python_type(rec);

        /* Register supplemental type information in C++ dict */
        auto *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) m_ptr;
        tinfo->cpptype = rec.type;
        tinfo->type_size = rec.type_size;
        tinfo->type_align = rec.type_align;
        tinfo->operator_new = rec.operator_new;
        tinfo->holder_size_in_ptrs = size_in_ptrs(rec.holder_size);
        tinfo->init_instance = rec.init_instance;
        tinfo->dealloc = rec.dealloc;
        tinfo->simple_type = true;
        tinfo->simple_ancestors = true;
        tinfo->default_holder = rec.default_holder;
        tinfo->module_local = rec.module_local;

        with_internals([&](internals &internals) {
            auto tindex = std::type_index(*rec.type);
            tinfo->direct_conversions = &internals.direct_conversions[tindex];
            if (rec.module_local) {
                get_local_internals().registered_types_cpp[tindex] = tinfo;
            } else {
                internals.registered_types_cpp[tindex] = tinfo;
            }
            internals.registered_types_py[(PyTypeObject *) m_ptr] = {tinfo};
        });

        if (rec.bases.size() > 1 || rec.multiple_inheritance) {
            mark_parents_nonsimple(tinfo->type);
            tinfo->simple_ancestors = false;
        } else if (rec.bases.size() == 1) {
            auto *parent_tinfo = get_type_info((PyTypeObject *) rec.bases[0].ptr());
            assert(parent_tinfo != nullptr);
            bool parent_simple_ancestors = parent_tinfo->simple_ancestors;
            tinfo->simple_ancestors = parent_simple_ancestors;
            // The parent can no longer be a simple type if it has MI and has a child
            parent_tinfo->simple_type = parent_tinfo->simple_type && parent_simple_ancestors;
        }

        if (rec.module_local) {
            // Stash the local typeinfo and loader so that external modules can access it.
            tinfo->module_local_load = &type_caster_generic::local_load;
            setattr(m_ptr, PYBIND11_MODULE_LOCAL_ID, capsule(tinfo));
        }
    }